

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

bool ON_TransformPointList(int dim,bool is_rat,int count,int stride,float *point,ON_Xform *xform)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool bVar12;
  bool bVar13;
  float *pfVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  if ((dim < 1) || ((point == (float *)0x0 || count < 0) || stride < (int)((uint)is_rat + dim))) {
    bVar12 = false;
  }
  else {
    if (count != 0) {
      if (!is_rat) {
        dVar2 = xform->m_xform[3][0];
        if (dim == 1) {
          dVar3 = xform->m_xform[3][3];
          dVar4 = xform->m_xform[0][0];
          dVar5 = xform->m_xform[0][3];
          bVar12 = true;
          do {
            dVar21 = dVar2 * (double)*point + dVar3;
            dVar20 = 1.0 / dVar21;
            bVar13 = false;
            if (dVar21 != 0.0) {
              bVar13 = bVar12;
            }
            if (NAN(dVar21)) {
              bVar13 = bVar12;
            }
            if ((dVar21 == 0.0) && (!NAN(dVar21))) {
              dVar20 = 1.0;
            }
            *point = (float)(((double)*point * dVar4 + dVar5) * dVar20);
            point = point + stride;
            count = count + -1;
            bVar12 = bVar13;
          } while (count != 0);
          return bVar13;
        }
        if (dim == 2) {
          dVar3 = xform->m_xform[3][1];
          dVar4 = xform->m_xform[3][3];
          dVar5 = xform->m_xform[0][0];
          dVar20 = xform->m_xform[0][1];
          dVar21 = xform->m_xform[0][3];
          dVar6 = xform->m_xform[1][0];
          dVar7 = xform->m_xform[1][1];
          dVar8 = xform->m_xform[1][3];
          pfVar14 = point + 1;
          bVar12 = true;
          do {
            dVar22 = (double)pfVar14[-1];
            dVar23 = (double)*pfVar14;
            dVar25 = dVar2 * dVar22 + dVar3 * dVar23 + dVar4;
            dVar24 = 1.0 / dVar25;
            bVar13 = false;
            if (dVar25 != 0.0) {
              bVar13 = bVar12;
            }
            if (NAN(dVar25)) {
              bVar13 = bVar12;
            }
            if ((dVar25 == 0.0) && (!NAN(dVar25))) {
              dVar24 = 1.0;
            }
            pfVar14[-1] = (float)((dVar5 * dVar22 + dVar20 * dVar23 + dVar21) * dVar24);
            *pfVar14 = (float)((dVar22 * dVar6 + dVar23 * dVar7 + dVar8) * dVar24);
            pfVar14 = pfVar14 + stride;
            count = count + -1;
            bVar12 = bVar13;
          } while (count != 0);
          return bVar13;
        }
        dVar3 = xform->m_xform[3][1];
        dVar4 = xform->m_xform[3][2];
        dVar5 = xform->m_xform[3][3];
        dVar20 = xform->m_xform[0][0];
        dVar21 = xform->m_xform[0][1];
        dVar6 = xform->m_xform[0][2];
        dVar7 = xform->m_xform[0][3];
        dVar8 = xform->m_xform[1][0];
        dVar22 = xform->m_xform[1][1];
        dVar23 = xform->m_xform[1][2];
        dVar24 = xform->m_xform[1][3];
        dVar25 = xform->m_xform[2][0];
        dVar9 = xform->m_xform[2][1];
        dVar10 = xform->m_xform[2][2];
        dVar11 = xform->m_xform[2][3];
        pfVar14 = point + 2;
        bVar12 = true;
        do {
          dVar17 = (double)pfVar14[-2];
          dVar18 = (double)pfVar14[-1];
          dVar15 = (double)*pfVar14;
          dVar19 = dVar4 * dVar15 + dVar2 * dVar17 + dVar3 * dVar18 + dVar5;
          dVar16 = 1.0 / dVar19;
          bVar13 = false;
          if (dVar19 != 0.0) {
            bVar13 = bVar12;
          }
          if (NAN(dVar19)) {
            bVar13 = bVar12;
          }
          if ((dVar19 == 0.0) && (!NAN(dVar19))) {
            dVar16 = 1.0;
          }
          pfVar14[-2] = (float)((dVar6 * dVar15 + dVar20 * dVar17 + dVar21 * dVar18 + dVar7) *
                               dVar16);
          pfVar14[-1] = (float)((dVar23 * dVar15 + dVar8 * dVar17 + dVar22 * dVar18 + dVar24) *
                               dVar16);
          *pfVar14 = (float)((dVar15 * dVar10 + dVar17 * dVar25 + dVar18 * dVar9 + dVar11) * dVar16)
          ;
          pfVar14 = pfVar14 + stride;
          count = count + -1;
          bVar12 = bVar13;
        } while (count != 0);
        return bVar13;
      }
      dVar2 = xform->m_xform[0][0];
      if (dim == 1) {
        dVar3 = xform->m_xform[0][3];
        dVar4 = xform->m_xform[3][0];
        dVar5 = xform->m_xform[3][3];
        pfVar14 = point + 1;
        do {
          fVar1 = pfVar14[-1];
          pfVar14[-1] = (float)(dVar2 * (double)fVar1 + dVar3 * (double)*pfVar14);
          *pfVar14 = (float)((double)fVar1 * dVar4 + (double)*pfVar14 * dVar5);
          pfVar14 = pfVar14 + stride;
          count = count + -1;
        } while (count != 0);
      }
      else if (dim == 2) {
        dVar3 = xform->m_xform[0][1];
        dVar4 = xform->m_xform[0][3];
        dVar5 = xform->m_xform[1][0];
        dVar20 = xform->m_xform[1][1];
        dVar21 = xform->m_xform[1][3];
        dVar6 = xform->m_xform[3][0];
        dVar7 = xform->m_xform[3][1];
        dVar8 = xform->m_xform[3][3];
        pfVar14 = point + 2;
        do {
          dVar22 = (double)pfVar14[-2];
          dVar23 = (double)pfVar14[-1];
          dVar24 = (double)*pfVar14;
          pfVar14[-2] = (float)(dVar4 * dVar24 + dVar2 * dVar22 + dVar3 * dVar23);
          pfVar14[-1] = (float)(dVar21 * dVar24 + dVar5 * dVar22 + dVar20 * dVar23);
          *pfVar14 = (float)(dVar24 * dVar8 + dVar22 * dVar6 + dVar23 * dVar7);
          pfVar14 = pfVar14 + stride;
          count = count + -1;
        } while (count != 0);
      }
      else {
        dVar3 = xform->m_xform[0][1];
        dVar4 = xform->m_xform[0][2];
        dVar5 = xform->m_xform[0][3];
        dVar20 = xform->m_xform[1][0];
        dVar21 = xform->m_xform[1][1];
        dVar6 = xform->m_xform[1][2];
        dVar7 = xform->m_xform[1][3];
        dVar8 = xform->m_xform[2][0];
        dVar22 = xform->m_xform[2][1];
        dVar23 = xform->m_xform[2][2];
        dVar24 = xform->m_xform[2][3];
        dVar25 = xform->m_xform[3][0];
        dVar9 = xform->m_xform[3][1];
        dVar10 = xform->m_xform[3][2];
        dVar11 = xform->m_xform[3][3];
        do {
          dVar15 = (double)*point;
          dVar18 = (double)point[1];
          dVar17 = (double)point[2];
          dVar16 = (double)point[(uint)dim];
          *point = (float)(dVar5 * dVar16 + dVar4 * dVar17 + dVar2 * dVar15 + dVar3 * dVar18);
          point[1] = (float)(dVar7 * dVar16 + dVar6 * dVar17 + dVar20 * dVar15 + dVar21 * dVar18);
          point[2] = (float)(dVar24 * dVar16 + dVar23 * dVar17 + dVar8 * dVar15 + dVar22 * dVar18);
          point[(uint)dim] =
               (float)(dVar16 * dVar11 + dVar17 * dVar10 + dVar15 * dVar25 + dVar18 * dVar9);
          point = point + stride;
          count = count + -1;
        } while (count != 0);
      }
    }
    bVar12 = true;
  }
  return bVar12;
}

Assistant:

bool 
ON_IsValidPointList(
       int dim,
       bool is_rat,
       int count,
       int stride,
       const float* p
       )
{
  return ( dim > 0 && stride >= (is_rat?(dim+1):dim) && count >= 0 && p != nullptr ) ? true : false;
}